

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O3

void __thiscall Assimp::XGLImporter::ReadFaceVertex(XGLImporter *this,TempMesh *t,TempFace *out)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  _Base_ptr p_Var8;
  bool bVar9;
  aiVector2D aVar10;
  aiVector3D aVar11;
  string local_a8;
  _Rb_tree_header *local_88;
  _Rb_tree_header *local_80;
  string local_78;
  aiVector3D *local_58;
  string local_50;
  
  GetElementName_abi_cxx11_(&local_50,this);
  local_58 = &out->normal;
  local_88 = &(t->uvs)._M_t._M_impl.super__Rb_tree_header;
  local_80 = &(t->normals)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = &(t->points)._M_t._M_impl.super__Rb_tree_header;
  bVar9 = false;
  do {
    bVar3 = ReadElementUpToClosing(this,local_50._M_dataplus._M_p);
    if (!bVar3) {
      if (!bVar9) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"missing <pref> in <fvN> element","");
        LogFunctions<Assimp::XGLImporter>::ThrowException(&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      return;
    }
    GetElementName_abi_cxx11_(&local_78,this);
    iVar4 = std::__cxx11::string::compare((char *)&local_78);
    if (iVar4 == 0) {
      uVar5 = ReadIndexFromText(this);
      p_Var8 = (t->points)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var6 = &p_Var1->_M_header;
      if (p_Var8 == (_Base_ptr)0x0) {
LAB_005cdb56:
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"point index out of range","");
        LogFunctions<Assimp::XGLImporter>::ThrowException(&local_a8);
        p_Var6 = &p_Var1->_M_header;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
      }
      else {
        do {
          bVar9 = (uint)*(size_t *)(p_Var8 + 1) < uVar5;
          if (!bVar9) {
            p_Var6 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[bVar9];
        } while (p_Var8 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var6 == p_Var1) ||
           (uVar5 < (uint)((_Rb_tree_header *)p_Var6)->_M_node_count)) goto LAB_005cdb56;
      }
      (out->pos).z = *(float *)((undefined1 *)((long)p_Var6 + 0x28) + 4);
      uVar2 = *(undefined8 *)((long)&((_Rb_tree_header *)p_Var6)->_M_node_count + 4);
      (out->pos).x = (float)(int)uVar2;
      (out->pos).y = (float)(int)((ulong)uVar2 >> 0x20);
      bVar9 = true;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&local_78);
      if (iVar4 == 0) {
        uVar5 = ReadIndexFromText(this);
        p_Var8 = (t->normals)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = local_80;
        if (p_Var8 == (_Base_ptr)0x0) {
LAB_005cdbe6:
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"normal index out of range","");
          LogFunctions<Assimp::XGLImporter>::ThrowException(&local_a8);
          p_Var7 = local_80;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
            p_Var7 = local_80;
          }
        }
        else {
          do {
            bVar3 = (uint)*(size_t *)(p_Var8 + 1) < uVar5;
            if (!bVar3) {
              p_Var7 = (_Rb_tree_header *)p_Var8;
            }
            p_Var8 = (&p_Var8->_M_left)[bVar3];
          } while (p_Var8 != (_Base_ptr)0x0);
          if ((p_Var7 == local_80) || (uVar5 < (uint)p_Var7->_M_node_count)) goto LAB_005cdbe6;
        }
        local_58->z = *(float *)((long)(p_Var7 + 1) + 4);
        uVar2 = *(undefined8 *)((long)&p_Var7->_M_node_count + 4);
        local_58->x = (float)(int)uVar2;
        local_58->y = (float)(int)((ulong)uVar2 >> 0x20);
        out->has_normal = true;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_78);
        if (iVar4 == 0) {
          uVar5 = ReadIndexFromText(this);
          p_Var8 = (t->uvs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var7 = local_88;
          if (p_Var8 == (_Base_ptr)0x0) {
LAB_005cdc7b:
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"uv index out of range","");
            LogFunctions<Assimp::XGLImporter>::ThrowException(&local_a8);
            p_Var7 = local_88;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
              p_Var7 = local_88;
            }
          }
          else {
            do {
              bVar3 = (uint)*(size_t *)(p_Var8 + 1) < uVar5;
              if (!bVar3) {
                p_Var7 = (_Rb_tree_header *)p_Var8;
              }
              p_Var8 = (&p_Var8->_M_left)[bVar3];
            } while (p_Var8 != (_Base_ptr)0x0);
            if ((p_Var7 == local_88) || (uVar5 < (uint)p_Var7->_M_node_count)) goto LAB_005cdc7b;
          }
          out->uv = *(aiVector2D *)((long)&p_Var7->_M_node_count + 4);
          out->has_uv = true;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_78);
          if (iVar4 == 0) {
            aVar11 = ReadVec3(this);
            out->pos = aVar11;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&local_78);
            if (iVar4 == 0) {
              aVar11 = ReadVec3(this);
              out->normal = aVar11;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)&local_78);
              if (iVar4 == 0) {
                aVar10 = ReadVec2(this);
                out->uv = aVar10;
              }
            }
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  } while( true );
}

Assistant:

void XGLImporter::ReadFaceVertex(const TempMesh& t, TempFace& out)
{
    const std::string& end = GetElementName();

    bool havep = false;
    while (ReadElementUpToClosing(end.c_str()))  {
        const std::string& s = GetElementName();
        if (s == "pref") {
            const unsigned int id = ReadIndexFromText();
            std::map<unsigned int, aiVector3D>::const_iterator it = t.points.find(id);
            if (it == t.points.end()) {
                ThrowException("point index out of range");
            }

            out.pos = (*it).second;
            havep = true;
        }
        else if (s == "nref") {
            const unsigned int id = ReadIndexFromText();
            std::map<unsigned int, aiVector3D>::const_iterator it = t.normals.find(id);
            if (it == t.normals.end()) {
                ThrowException("normal index out of range");
            }

            out.normal = (*it).second;
            out.has_normal = true;
        }
        else if (s == "tcref") {
            const unsigned int id = ReadIndexFromText();
            std::map<unsigned int, aiVector2D>::const_iterator it = t.uvs.find(id);
            if (it == t.uvs.end()) {
                ThrowException("uv index out of range");
            }

            out.uv = (*it).second;
            out.has_uv = true;
        }
        else if (s == "p") {
            out.pos = ReadVec3();
        }
        else if (s == "n") {
            out.normal = ReadVec3();
        }
        else if (s == "tc") {
            out.uv = ReadVec2();
        }
    }

    if (!havep) {
        ThrowException("missing <pref> in <fvN> element");
    }
}